

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxColorLiteral::Emit(FxColorLiteral *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint opc;
  undefined4 extraout_var;
  ExpEmit EVar6;
  long lVar7;
  long lVar8;
  
  uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  uVar2 = uVar2 & 0xffff;
  uVar3 = VMFunctionBuilder::GetConstantInt(build,this->constval);
  VMFunctionBuilder::Emit(build,2,uVar2,(VM_SHALF)uVar3);
  lVar7 = 0x18;
  lVar8 = 0;
  do {
    pFVar1 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[lVar8];
    if (pFVar1 != (FxExpression *)0x0) {
      iVar4 = (*pFVar1->_vptr_FxExpression[3])();
      if ((char)iVar4 != '\0') {
        __assert_fail("!ArgList[i]->isConstant()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x20f8,"virtual ExpEmit FxColorLiteral::Emit(VMFunctionBuilder *)");
      }
      pFVar1 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[lVar8];
      uVar3 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
      if ((CONCAT44(extraout_var,uVar3) & 0x10100fc0000) == 0) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + (uVar3 >> 0x10 & 3),uVar3 & 0xffff,uVar3 >> 0x18);
      }
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      uVar5 = uVar5 & 0xffff;
      opc = VMFunctionBuilder::GetConstantInt(build,0);
      VMFunctionBuilder::Emit(build,0x80,uVar5,uVar3 & 0xffff,opc);
      uVar3 = VMFunctionBuilder::GetConstantInt(build,0xff);
      VMFunctionBuilder::Emit(build,0x7e,uVar5,uVar5,uVar3);
      if (lVar7 != 0) {
        VMFunctionBuilder::Emit(build,0x5b,uVar5,uVar5,(int)lVar7);
      }
      VMFunctionBuilder::Emit(build,0x79,uVar2,uVar2,uVar5);
    }
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + -8;
  } while (lVar8 != 4);
  EVar6._0_4_ = uVar2 | 0x1000000;
  EVar6.Konst = false;
  EVar6.Fixed = false;
  EVar6.Final = false;
  EVar6.Target = false;
  return EVar6;
}

Assistant:

ExpEmit FxColorLiteral::Emit(VMFunctionBuilder *build)
{
	ExpEmit out(build, REGT_INT);
	build->Emit(OP_LK, out.RegNum, build->GetConstantInt(constval));
	for (int i = 0; i < 4; i++)
	{
		if (ArgList[i] != nullptr)
		{
			assert(!ArgList[i]->isConstant());
			ExpEmit in = ArgList[i]->Emit(build);
			in.Free(build);
			ExpEmit work(build, REGT_INT);
			build->Emit(OP_MAX_RK, work.RegNum, in.RegNum, build->GetConstantInt(0));
			build->Emit(OP_MIN_RK, work.RegNum, work.RegNum, build->GetConstantInt(255));
			if (i != 3) build->Emit(OP_SLL_RI, work.RegNum, work.RegNum, 24 - (i * 8));
			build->Emit(OP_OR_RR, out.RegNum, out.RegNum, work.RegNum);
		}
	}
	return out;
}